

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Cluster::~Cluster(Cluster *this)

{
  pointer puVar1;
  pointer pfVar2;
  
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Cluster_0025a058;
  puVar1 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pfVar2 = (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
  }
  Deformer::~Deformer(&this->super_Deformer);
  return;
}

Assistant:

Cluster::~Cluster()
{

}